

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::handle_store_to_invariant_variable
          (CompilerGLSL *this,uint32_t store_id,uint32_t value_id)

{
  bool bVar1;
  SPIRExpression *expr_00;
  SPIRExpression *expr;
  uint32_t local_18;
  uint32_t local_14;
  uint32_t value_id_local;
  uint32_t store_id_local;
  CompilerGLSL *this_local;
  
  local_18 = value_id;
  local_14 = store_id;
  _value_id_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&expr + 4),store_id);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,expr._4_4_,DecorationInvariant);
  if ((((bVar1 ^ 0xffU) & 1) == 0) &&
     (expr_00 = Compiler::maybe_get<spirv_cross::SPIRExpression>(&this->super_Compiler,local_18),
     expr_00 != (SPIRExpression *)0x0)) {
    disallow_forwarding_in_expression_chain(this,expr_00);
  }
  return;
}

Assistant:

void CompilerGLSL::handle_store_to_invariant_variable(uint32_t store_id, uint32_t value_id)
{
	// Variables or access chains marked invariant are complicated. We will need to make sure the code-gen leading up to
	// this variable is consistent. The failure case for SPIRV-Cross is when an expression is forced to a temporary
	// in one translation unit, but not another, e.g. due to multiple use of an expression.
	// This causes variance despite the output variable being marked invariant, so the solution here is to force all dependent
	// expressions to be temporaries.
	// It is uncertain if this is enough to support invariant in all possible cases, but it should be good enough
	// for all reasonable uses of invariant.
	if (!has_decoration(store_id, DecorationInvariant))
		return;

	auto *expr = maybe_get<SPIRExpression>(value_id);
	if (!expr)
		return;

	disallow_forwarding_in_expression_chain(*expr);
}